

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GLSL420Pack::InitializerListNegativeTest::prepareNextTestCase
          (InitializerListNegativeTest *this,GLuint test_case_index)

{
  this->m_current_test_case_index = test_case_index;
  if (test_case_index == 0xffffffff) {
    this->m_current_test_case_index = 0;
    return true;
  }
  if ((ulong)test_case_index <
      (ulong)((long)(this->m_test_cases).
                    super__Vector_base<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS,_std::allocator<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_test_cases).
                    super__Vector_base<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS,_std::allocator<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2)) {
    logTestCaseName(this);
    return true;
  }
  return false;
}

Assistant:

bool InitializerListNegativeTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		m_current_test_case_index = 0;
		return true;
	}
	else if (m_test_cases.size() <= test_case_index)
	{
		return false;
	}

	logTestCaseName();

	return true;
}